

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O3

bool tcu::intThresholdCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,ConstPixelBufferAccess *reference
               ,ConstPixelBufferAccess *result,UVec4 *threshold,CompareLogMode logMode)

{
  ostringstream *poVar1;
  int width;
  int height;
  int depth;
  ChannelOrder CVar2;
  TextureFormat TVar3;
  TextureFormat TVar4;
  ulong uVar5;
  TextureChannelClass TVar6;
  InternalError *this;
  ulong uVar7;
  ConstPixelBufferAccess *pCVar8;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int y;
  ChannelOrder __fd;
  _Alloc_hider _Var9;
  int z;
  int z_00;
  bool bVar10;
  undefined1 auVar11 [16];
  uint uVar12;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  undefined1 auVar13 [16];
  uint uVar17;
  uint uVar19;
  uint uVar20;
  undefined1 auVar18 [16];
  uint uVar21;
  Vector<bool,_4> res;
  IVec4 cmpPix;
  PixelBufferAccess errorMask;
  TextureLevel errorMaskStorage;
  IVec4 refPix;
  allocator<char> local_4c2;
  allocator<char> local_4c1;
  TextureFormat local_4c0;
  ConstPixelBufferAccess *local_4b8;
  UVec4 *local_4b0;
  Vec4 local_4a8;
  Vec4 local_498;
  string local_488;
  string local_468;
  char *local_448;
  char *local_440;
  Vector<unsigned_int,_4> local_438;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  LogImageSet local_368;
  LogImage local_328;
  LogImage local_298;
  ConstPixelBufferAccess local_208;
  TextureLevel local_1e0;
  undefined1 local_1b8 [32];
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [4];
  ios_base local_140 [272];
  
  width = (reference->m_size).m_data[0];
  height = (reference->m_size).m_data[1];
  depth = (reference->m_size).m_data[2];
  local_1b8._0_4_ = RGB;
  local_1b8._4_4_ = UNORM_INT8;
  local_4b8 = reference;
  local_4b0 = threshold;
  local_440 = imageSetName;
  TextureLevel::TextureLevel(&local_1e0,(TextureFormat *)local_1b8,width,height,depth);
  TextureLevel::getAccess((PixelBufferAccess *)&local_208,&local_1e0);
  local_438.m_data[0] = 0;
  local_438.m_data[1] = 0;
  local_438.m_data[2] = 0;
  local_438.m_data[3] = 0;
  local_498.m_data[0] = 0.0;
  local_498.m_data[1] = 0.0;
  local_498.m_data[2] = 0.0;
  local_498.m_data[3] = 0.0;
  local_4a8.m_data[0] = 1.0;
  local_4a8.m_data[1] = 1.0;
  local_4a8.m_data[2] = 1.0;
  local_4a8.m_data[3] = 1.0;
  local_4c0 = (TextureFormat)log;
  local_448 = imageSetDesc;
  if ((((result->m_size).m_data[0] != width) || ((result->m_size).m_data[1] != height)) ||
     ((result->m_size).m_data[2] != depth)) {
    this = (InternalError *)__cxa_allocate_exception(0x38);
    InternalError::InternalError
              (this,(char *)0x0,
               "result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageCompare.cpp"
               ,0x2f2);
    __cxa_throw(this,&InternalError::typeinfo,Exception::~Exception);
  }
  if (0 < depth) {
    z = 0;
    do {
      if (0 < height) {
        z_00 = 0;
        do {
          if (0 < width) {
            y = 0;
            do {
              ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)local_1b8,(int)local_4b8,y,z_00);
              ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)&local_298,(int)result,y,z_00);
              uVar12 = local_1b8._0_4_ - (int)local_298.m_name._M_dataplus._M_p >> 0x1f;
              uVar14 = local_1b8._4_4_ - local_298.m_name._M_dataplus._M_p._4_4_ >> 0x1f;
              uVar15 = local_1b8._8_4_ - (int)local_298.m_name._M_string_length >> 0x1f;
              uVar16 = local_1b8._12_4_ - local_298.m_name._M_string_length._4_4_ >> 0x1f;
              uVar12 = (local_1b8._0_4_ - (int)local_298.m_name._M_dataplus._M_p ^ uVar12) - uVar12;
              uVar14 = (local_1b8._4_4_ - local_298.m_name._M_dataplus._M_p._4_4_ ^ uVar14) - uVar14
              ;
              uVar15 = (local_1b8._8_4_ - (int)local_298.m_name._M_string_length ^ uVar15) - uVar15;
              uVar16 = (local_1b8._12_4_ - local_298.m_name._M_string_length._4_4_ ^ uVar16) -
                       uVar16;
              uVar17 = uVar12 ^ 0x80000000;
              uVar19 = uVar14 ^ 0x80000000;
              uVar20 = uVar15 ^ 0x80000000;
              uVar21 = uVar16 ^ 0x80000000;
              auVar18._0_4_ = -(uint)((int)(local_4b0->m_data[0] ^ 0x80000000) < (int)uVar17);
              auVar18._4_4_ = -(uint)((int)(local_4b0->m_data[1] ^ 0x80000000) < (int)uVar19);
              auVar18._8_4_ = -(uint)((int)(local_4b0->m_data[2] ^ 0x80000000) < (int)uVar20);
              auVar18._12_4_ = -(uint)((int)(local_4b0->m_data[3] ^ 0x80000000) < (int)uVar21);
              auVar18 = packssdw(auVar18,auVar18);
              auVar18 = packsswb(auVar18 ^ _DAT_0021f0a0,auVar18 ^ _DAT_0021f0a0);
              if ((byte)(auVar18[0] & DAT_0021e660) == 0) {
                bVar10 = false;
              }
              else {
                uVar5 = 0;
                do {
                  uVar7 = uVar5;
                  if (uVar7 == 3) break;
                  uVar5 = uVar7 + 1;
                } while (*(char *)((long)local_328.m_access.m_size.m_data + (uVar7 - 0x47)) != '\0')
                ;
                bVar10 = 2 < uVar7;
              }
              uVar17 = -(uint)((int)uVar17 < (int)(local_438.m_data[0] ^ 0x80000000));
              uVar19 = -(uint)((int)uVar19 < (int)(local_438.m_data[1] ^ 0x80000000));
              uVar20 = -(uint)((int)uVar20 < (int)(local_438.m_data[2] ^ 0x80000000));
              uVar21 = -(uint)((int)uVar21 < (int)(local_438.m_data[3] ^ 0x80000000));
              local_328.m_name._M_dataplus._M_p._0_4_ = 0xff;
              if (bVar10) {
                local_328.m_name._M_dataplus._M_p._0_4_ = 0;
              }
              local_328.m_name._M_dataplus._M_p._4_4_ = 0;
              if (bVar10) {
                local_328.m_name._M_dataplus._M_p._4_4_ = 0xff;
              }
              local_438.m_data[1] = ~uVar19 & uVar14 | local_438.m_data[1] & uVar19;
              local_438.m_data[0] = ~uVar17 & uVar12 | local_438.m_data[0] & uVar17;
              local_438.m_data[3] = ~uVar21 & uVar16 | local_438.m_data[3] & uVar21;
              local_438.m_data[2] = ~uVar20 & uVar15 | local_438.m_data[2] & uVar20;
              local_328.m_name._M_string_length = 0xff00000000;
              PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)&local_208,(IVec4 *)&local_328,y,z_00,z);
              y = y + 1;
            } while (y != width);
          }
          z_00 = z_00 + 1;
        } while (z_00 != height);
      }
      z = z + 1;
    } while (z != depth);
  }
  TVar3 = local_4c0;
  auVar13._0_4_ =
       -(uint)((int)(local_4b0->m_data[0] ^ 0x80000000) < (int)(local_438.m_data[0] ^ 0x80000000));
  auVar13._4_4_ =
       -(uint)((int)(local_4b0->m_data[1] ^ 0x80000000) < (int)(local_438.m_data[1] ^ 0x80000000));
  auVar13._8_4_ =
       -(uint)((int)(local_4b0->m_data[2] ^ 0x80000000) < (int)(local_438.m_data[2] ^ 0x80000000));
  auVar13._12_4_ =
       -(uint)((int)(local_4b0->m_data[3] ^ 0x80000000) < (int)(local_438.m_data[3] ^ 0x80000000));
  auVar18 = packssdw(auVar13,auVar13);
  auVar11._8_4_ = 0xffffffff;
  auVar11._0_8_ = 0xffffffffffffffff;
  auVar11._12_4_ = 0xffffffff;
  auVar18 = packsswb(auVar11 ^ auVar18,auVar11 ^ auVar18);
  CVar2 = auVar18._0_4_ & (ChannelOrder)DAT_0021e660;
  local_1b8._4_4_ = SUB84(local_1b8._0_8_,4);
  local_1b8._0_4_ = CVar2;
  __fd = local_4c0.order;
  if ((char)CVar2 == '\0') {
    bVar10 = false;
LAB_001da447:
    TVar6 = getTextureChannelClass((local_4b8->m_format).type);
    if ((TVar6 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) ||
       (TVar6 = getTextureChannelClass((result->m_format).type),
       TVar6 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)) {
      anon_unknown_50::computeScaleAndBias(local_4b8,result,&local_4a8,&local_498);
      TVar4 = local_4c0;
      poVar1 = (ostringstream *)(local_1b8 + 8);
      local_4c0.order = TVar3.order;
      local_4c0.type = TVar3.type;
      local_1b8._0_4_ = local_4c0.order;
      local_1b8._4_4_ = local_4c0.type;
      local_4c0 = TVar4;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Result and reference images are normalized with formula p * ",
                 0x3c);
      operator<<((ostream *)poVar1,&local_4a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," + ",3);
      operator<<((ostream *)poVar1,&local_498);
      MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_140);
    }
    TVar4 = local_4c0;
    if (bVar10 == false) {
      poVar1 = (ostringstream *)(local_1b8 + 8);
      local_4c0.order = TVar3.order;
      local_4c0.type = TVar3.type;
      local_1b8._0_4_ = local_4c0.order;
      local_1b8._4_4_ = local_4c0.type;
      local_4c0 = TVar4;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Image comparison failed: max difference = ",0x2a);
      operator<<((ostream *)poVar1,&local_438);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", threshold = ",0xe);
      operator<<((ostream *)poVar1,local_4b0);
      MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_140);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,local_440,&local_4c1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,local_448,&local_4c2);
    LogImageSet::LogImageSet(&local_368,&local_468,&local_488);
    TestLog::startImageSet
              ((TestLog *)TVar3,local_368.m_name._M_dataplus._M_p,
               local_368.m_description._M_dataplus._M_p);
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"Result","");
    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"Result","");
    LogImage::LogImage((LogImage *)local_1b8,&local_408,&local_428,result,&local_4a8,&local_498,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_1b8,__fd,__buf_00,(size_t)result);
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"Reference","");
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"Reference","");
    pCVar8 = local_4b8;
    LogImage::LogImage(&local_298,&local_388,&local_3a8,local_4b8,&local_4a8,&local_498,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write(&local_298,local_4c0.order,__buf_01,(size_t)pCVar8);
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"ErrorMask","");
    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"Error mask","");
    pCVar8 = &local_208;
    LogImage::LogImage(&local_328,&local_3c8,&local_3e8,pCVar8,QP_IMAGE_COMPRESSION_MODE_BEST);
    TVar3 = local_4c0;
    LogImage::write(&local_328,local_4c0.order,__buf_02,(size_t)pCVar8);
    TestLog::endImageSet((TestLog *)TVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328.m_description._M_dataplus._M_p != &local_328.m_description.field_2) {
      operator_delete(local_328.m_description._M_dataplus._M_p,
                      local_328.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_328.m_name._M_dataplus._M_p._4_4_,local_328.m_name._M_dataplus._M_p._0_4_)
        != &local_328.m_name.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_328.m_name._M_dataplus._M_p._4_4_,
                               local_328.m_name._M_dataplus._M_p._0_4_),
                      local_328.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.m_description._M_dataplus._M_p != &local_298.m_description.field_2) {
      operator_delete(local_298.m_description._M_dataplus._M_p,
                      local_298.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_298.m_name._M_dataplus._M_p._4_4_,(int)local_298.m_name._M_dataplus._M_p)
        != &local_298.m_name.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_298.m_name._M_dataplus._M_p._4_4_,
                               (int)local_298.m_name._M_dataplus._M_p),
                      local_298.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != local_188) {
      operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
    }
    if (local_1b8._0_8_ != (long)local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368.m_description._M_dataplus._M_p != &local_368.m_description.field_2) {
      operator_delete(local_368.m_description._M_dataplus._M_p,
                      local_368.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368.m_name._M_dataplus._M_p != &local_368.m_name.field_2) {
      operator_delete(local_368.m_name._M_dataplus._M_p,
                      local_368.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    _Var9._M_p = local_468._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p == &local_468.field_2) goto LAB_001da9b2;
  }
  else {
    uVar5 = 0;
    do {
      uVar7 = uVar5;
      if (uVar7 == 3) break;
      uVar5 = uVar7 + 1;
    } while (local_1b8[uVar7 + 1] != '\0');
    bVar10 = 2 < uVar7;
    if (logMode == COMPARE_LOG_EVERYTHING || !bVar10) goto LAB_001da447;
    if (logMode != COMPARE_LOG_RESULT) goto LAB_001da9b2;
    if (((result->m_format).order != RGBA) || ((result->m_format).type != UNORM_INT8)) {
      computePixelScaleBias(result,&local_4a8,&local_498);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,local_440,(allocator<char> *)&local_408);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,local_448,(allocator<char> *)&local_428);
    LogImageSet::LogImageSet((LogImageSet *)&local_298,&local_328.m_name,&local_368.m_name);
    TestLog::startImageSet
              ((TestLog *)TVar3,
               (char *)CONCAT44(local_298.m_name._M_dataplus._M_p._4_4_,
                                (int)local_298.m_name._M_dataplus._M_p),
               local_298.m_description._M_dataplus._M_p);
    local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"Result","");
    local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"Result","");
    LogImage::LogImage((LogImage *)local_1b8,&local_468,&local_488,result,&local_4a8,&local_498,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_1b8,__fd,__buf,(size_t)result);
    TestLog::endImageSet((TestLog *)TVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != local_188) {
      operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
    }
    if (local_1b8._0_8_ != (long)local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.m_description._M_dataplus._M_p != &local_298.m_description.field_2) {
      operator_delete(local_298.m_description._M_dataplus._M_p,
                      local_298.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_298.m_name._M_dataplus._M_p._4_4_,(int)local_298.m_name._M_dataplus._M_p)
        != &local_298.m_name.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_298.m_name._M_dataplus._M_p._4_4_,
                               (int)local_298.m_name._M_dataplus._M_p),
                      local_298.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368.m_name._M_dataplus._M_p != &local_368.m_name.field_2) {
      operator_delete(local_368.m_name._M_dataplus._M_p,
                      local_368.m_name.field_2._M_allocated_capacity + 1);
    }
    _Var9._M_p = (pointer)CONCAT44(local_328.m_name._M_dataplus._M_p._4_4_,
                                   local_328.m_name._M_dataplus._M_p._0_4_);
    local_468.field_2._M_allocated_capacity = local_328.m_name.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var9._M_p == &local_328.m_name.field_2) goto LAB_001da9b2;
  }
  operator_delete(_Var9._M_p,local_468.field_2._M_allocated_capacity + 1);
LAB_001da9b2:
  TextureLevel::~TextureLevel(&local_1e0);
  return bVar10;
}

Assistant:

bool intThresholdCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const UVec4& threshold, CompareLogMode logMode)
{
	int					width				= reference.getWidth();
	int					height				= reference.getHeight();
	int					depth				= reference.getDepth();
	TextureLevel		errorMaskStorage	(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), width, height, depth);
	PixelBufferAccess	errorMask			= errorMaskStorage.getAccess();
	UVec4				maxDiff				(0, 0, 0, 0);
	Vec4				pixelBias			(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelScale			(1.0f, 1.0f, 1.0f, 1.0f);

	TCU_CHECK_INTERNAL(result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth);

	for (int z = 0; z < depth; z++)
	{
		for (int y = 0; y < height; y++)
		{
			for (int x = 0; x < width; x++)
			{
				IVec4	refPix		= reference.getPixelInt(x, y, z);
				IVec4	cmpPix		= result.getPixelInt(x, y, z);

				UVec4	diff		= abs(refPix - cmpPix).cast<deUint32>();
				bool	isOk		= boolAll(lessThanEqual(diff, threshold));

				maxDiff = max(maxDiff, diff);

				errorMask.setPixel(isOk ? IVec4(0, 0xff, 0, 0xff) : IVec4(0xff, 0, 0, 0xff), x, y, z);
			}
		}
	}

	bool compareOk = boolAll(lessThanEqual(maxDiff, threshold));

	if (!compareOk || logMode == COMPARE_LOG_EVERYTHING)
	{
		// All formats except normalized unsigned fixed point ones need remapping in order to fit into unorm channels in logged images.
		if (tcu::getTextureChannelClass(reference.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT ||
			tcu::getTextureChannelClass(result.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
		{
			computeScaleAndBias(reference, result, pixelScale, pixelBias);
			log << TestLog::Message << "Result and reference images are normalized with formula p * " << pixelScale << " + " << pixelBias << TestLog::EndMessage;
		}

		if (!compareOk)
			log << TestLog::Message << "Image comparison failed: max difference = " << maxDiff << ", threshold = " << threshold << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::Image("Reference",	"Reference",	reference,	pixelScale, pixelBias)
			<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	return compareOk;
}